

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::(anonymous_namespace)::ClosureTest_TestClosureMethod1_Test>::
CreateTest(TestFactoryImpl<google::protobuf::(anonymous_namespace)::ClosureTest_TestClosureMethod1_Test>
           *this)

{
  ClosureTest *this_00;
  
  this_00 = (ClosureTest *)operator_new(0x48);
  google::protobuf::anon_unknown_0::ClosureTest::ClosureTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__ClosureTest_01674548;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }